

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ScatterAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_scatteralongaxis
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  ScatterAlongAxisLayerParams *pSVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x3ba) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ba;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pSVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ScatterAlongAxisLayerParams>(arena);
    (this->layer_).scatteralongaxis_ = pSVar2;
  }
  return (ScatterAlongAxisLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterAlongAxisLayerParams* NeuralNetworkLayer::_internal_mutable_scatteralongaxis() {
  if (!_internal_has_scatteralongaxis()) {
    clear_layer();
    set_has_scatteralongaxis();
    layer_.scatteralongaxis_ = CreateMaybeMessage< ::CoreML::Specification::ScatterAlongAxisLayerParams >(GetArenaForAllocation());
  }
  return layer_.scatteralongaxis_;
}